

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool __thiscall ON_Hatch::Write(ON_Hatch *this,ON_BinaryArchive *ar)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ON_OBSOLETE_V5_HatchExtra *pOVar5;
  ON__INT32 i;
  ulong uVar6;
  ON_2dPoint basepoint;
  ON_2dPoint local_40;
  
  iVar4 = ON_BinaryArchive::Archive3dmVersion(ar);
  bVar2 = ON_BinaryArchive::Write3dmChunkVersion(ar,1,(0x3b < iVar4) + 1);
  if (bVar2) {
    bVar2 = ON_BinaryArchive::WritePlane(ar,&this->m_plane);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteDouble(ar,this->m_pattern_scale);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WriteDouble(ar,this->m_pattern_rotation);
  }
  if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                      (ar,HatchPattern,this->m_pattern_index);
  }
  if (bVar2 != false) {
    iVar1 = (this->m_loops).m_count;
    i = 0;
    if (0 < iVar1) {
      i = iVar1;
    }
    bVar2 = ON_BinaryArchive::WriteInt(ar,i);
    if (bVar2 && 0 < (long)iVar1) {
      uVar6 = 1;
      do {
        bVar2 = ON_HatchLoop::Write((this->m_loops).m_a[uVar6 - 1],ar);
        if ((ulong)(long)iVar1 <= uVar6) break;
        uVar6 = uVar6 + 1;
      } while (bVar2);
    }
  }
  local_40.x = (this->m_basepoint).x;
  local_40.y = (this->m_basepoint).y;
  if (iVar4 < 0x3c) {
    bVar3 = ON_2dPoint::IsValid(&local_40);
    if (bVar3) {
      bVar3 = ON_2dPoint::IsZero(&local_40);
      if (!bVar3) {
        iVar4 = ON_BinaryArchive::Archive3dmVersion(ar);
        if (iVar4 == 0x32) {
          pOVar5 = ON_OBSOLETE_V5_HatchExtra::HatchExtension(this);
          if (pOVar5 != (ON_OBSOLETE_V5_HatchExtra *)0x0) {
            (pOVar5->m_basepoint).x = local_40.x;
            (pOVar5->m_basepoint).y = local_40.y;
          }
        }
      }
    }
  }
  else if (bVar2 != false) {
    bVar2 = ON_BinaryArchive::WritePoint(ar,&local_40);
  }
  return bVar2;
}

Assistant:

bool ON_Hatch::Write( ON_BinaryArchive& ar) const
{
  // Added basepoint to 1.2;
  const int minor_version = (ar.Archive3dmVersion() >= 60) ? 2 : 1;
  bool rc = ar.Write3dmChunkVersion(1,minor_version);
  if (rc) rc = ar.WritePlane( m_plane);
  if (rc) rc = ar.WriteDouble( m_pattern_scale);
  if (rc) rc = ar.WriteDouble( m_pattern_rotation);
  if (rc) rc = ar.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::HatchPattern, m_pattern_index);
  if (rc)
  {
    int i, count = m_loops.Count();
    if( count < 0 )
      count = 0;
    rc = ar.WriteInt( count);
    for( i = 0; i < count && rc; i++)
      rc = m_loops[i]->Write( ar);
  }
  const ON_2dPoint basepoint = BasePoint2d();
  if (minor_version >= 2)
  {
    // m_basepoint = a 2d (x,y) point.
    if (rc) rc = ar.WritePoint(basepoint);
  }
  else if (
    basepoint.IsValid() 
    && false == basepoint.IsZero()
    && 50 == ar.Archive3dmVersion()
    )
  {
    // add temporary V5 user data cache
    ON_OBSOLETE_V5_HatchExtra* v5_ud = ON_OBSOLETE_V5_HatchExtra::HatchExtension(this);
    if( nullptr!= v5_ud)
      v5_ud->m_basepoint = basepoint;
  }
  return rc;
}